

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

int __thiscall ncnn::Clip::forward_inplace_int8(Clip *this,Mat *bottom_top_blob,Option *opt)

{
  char cVar1;
  void *pvVar2;
  int i;
  ulong uVar3;
  char cVar4;
  int iVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  Mat local_70;
  
  iVar10 = bottom_top_blob->c;
  uVar7 = bottom_top_blob->h * bottom_top_blob->w;
  fVar12 = this->max;
  fVar11 = roundf(this->min);
  iVar5 = (int)fVar11;
  if ((int)fVar11 < -0x7e) {
    iVar5 = -0x7f;
  }
  cVar6 = (char)iVar5;
  if (0x7e < iVar5) {
    cVar6 = '\x7f';
  }
  fVar12 = roundf(fVar12);
  iVar5 = -0x7f;
  if (-0x7f < (int)fVar12) {
    iVar5 = (int)fVar12;
  }
  cVar9 = (char)iVar5;
  if (0x7e < iVar5) {
    cVar9 = '\x7f';
  }
  uVar3 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar3;
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  while (iVar5 = (int)uVar3, iVar5 != iVar10) {
    Mat::channel(&local_70,bottom_top_blob,iVar5);
    pvVar2 = local_70.data;
    Mat::~Mat(&local_70);
    for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      cVar1 = *(char *)((long)pvVar2 + uVar3);
      cVar4 = cVar1;
      if (cVar1 <= cVar6) {
        cVar4 = cVar6;
      }
      if ((cVar1 < cVar6) || (cVar9 < cVar4)) {
        if (cVar9 <= cVar4) {
          cVar4 = cVar9;
        }
        *(char *)((long)pvVar2 + uVar3) = cVar4;
      }
    }
    uVar3 = (ulong)(iVar5 + 1);
  }
  return 0;
}

Assistant:

int Clip::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
    signed char min_int8 = float2int8(min);
    signed char max_int8 = float2int8(max);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        signed char* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < min_int8)
                ptr[i] = min_int8;
            if (ptr[i] > max_int8)
                ptr[i] = max_int8;
        }
    }

    return 0;
}